

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O2

Matrix33 * AML::transpose(Matrix33 *__return_storage_ptr__,Matrix33 *rhs)

{
  double result [9];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  local_58 = (rhs->field_0).data[0][0];
  local_50 = (rhs->field_0).data[1][0];
  local_48 = (rhs->field_0).data[2][0];
  local_40 = (rhs->field_0).data[0][1];
  local_38 = (rhs->field_0).data[1][1];
  local_30 = (rhs->field_0).data[2][1];
  local_28 = (rhs->field_0).data[0][2];
  local_20 = (rhs->field_0).data[1][2];
  local_18 = (rhs->field_0).data[2][2];
  Matrix33::Matrix33(__return_storage_ptr__,&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 transpose(const Matrix33& rhs)
    {
        double result[9];
        result[0] = rhs.m11;
        result[1] = rhs.m21;
        result[2] = rhs.m31;
        result[3] = rhs.m12;
        result[4] = rhs.m22;
        result[5] = rhs.m32;
        result[6] = rhs.m13;
        result[7] = rhs.m23;
        result[8] = rhs.m33;
        return Matrix33(result);
    }